

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_ns.c
# Opt level: O0

ENCODING * XmlGetUtf16InternalEncoding(void)

{
  return &internal_little2_encoding.enc;
}

Assistant:

const ENCODING *
NS(XmlGetUtf16InternalEncoding)(void) {
#  if BYTEORDER == 1234
  return &ns(internal_little2_encoding).enc;
#  elif BYTEORDER == 4321
  return &ns(internal_big2_encoding).enc;
#  else
  const short n = 1;
  return (*(const char *)&n ? &ns(internal_little2_encoding).enc
                            : &ns(internal_big2_encoding).enc);
#  endif
}